

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp0_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  bVar2 = (byte)(iVar + -6);
  iVar1 = -4 << (bVar2 & 0x1f);
  if (nWords < 1) {
    iVar5 = 0;
    iVar1 = 0;
  }
  else {
    uVar6 = 1 << (bVar2 & 0x1f);
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 2) {
      uVar7 = 1;
    }
    iVar5 = nWords + -1;
    iVar3 = nWords + (-3 << (bVar2 & 0x1f)) + -1;
    do {
      if (iVar + -6 != 0x1f) {
        lVar8 = 0;
        do {
          iVar4 = -(uint)(pInOut[iVar5 + lVar8] < pInOut[iVar3 + (int)lVar8]);
          if (pInOut[iVar3 + (int)lVar8] < pInOut[iVar5 + lVar8]) {
            iVar4 = 1;
          }
          if (iVar4 != 0) {
            iVar5 = iVar5 + 1;
            if (iVar4 == -1) goto LAB_0056201f;
            iVar1 = 3;
            goto LAB_00562036;
          }
          lVar8 = lVar8 + -1;
        } while (-lVar8 != uVar7);
      }
      iVar3 = iVar3 + iVar1;
      iVar5 = iVar5 + iVar1;
    } while (-1 < iVar5);
    iVar5 = 0;
LAB_0056201f:
    iVar1 = 0;
  }
LAB_00562036:
  *pDifStart = iVar5;
  return iVar1;
}

Assistant:

int minTemp0_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int wordDif = 3*wordBlock;
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp0_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordDif]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 3;
            }
        }
    *pDifStart=0;
//    printf("out minTemp0_fast_moreThen5\n");

    return 0;
}